

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

void __thiscall UniValue::checkType(UniValue *this,VType *expected)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == *expected) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    if ((ulong)this->typ < 6) {
      pcVar3 = (&PTR_anon_var_dwarf_13312_001103b0)[this->typ];
    }
    else {
      pcVar3 = (char *)0x0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar3,&local_c9);
    std::operator+(&local_88,"JSON value of type ",&local_a8);
    pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_88," is not of expected type ");
    local_68._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
    paVar2 = &pbVar1->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar2) {
      local_68.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar1->_M_string_length;
    (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_local_buf[0] = '\0';
    if ((ulong)*expected < 6) {
      pcVar3 = (&PTR_anon_var_dwarf_13312_001103b0)[*expected];
    }
    else {
      pcVar3 = (char *)0x0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar3,&local_ca);
    std::operator+(&local_48,&local_68,&local_c8);
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    *(undefined ***)this_00 = &PTR__runtime_error_00110398;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::checkType(const VType& expected) const
{
    if (typ != expected) {
        throw type_error{"JSON value of type " + std::string{uvTypeName(typ)} + " is not of expected type " +
                                 std::string{uvTypeName(expected)}};
    }
}